

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

void int_block(void)

{
  sigset_t signals;
  sigset_t sStack_88;
  
  sigemptyset(&sStack_88);
  sigaddset(&sStack_88,0x1a);
  sigaddset(&sStack_88,0x1d);
  sigaddset(&sStack_88,0xe);
  sigaddset(&sStack_88,0x19);
  sigprocmask(0,&sStack_88,(sigset_t *)0x0);
  return;
}

Assistant:

void int_block(void) {
/* temporarily turn off interrupts */
#ifdef DOS
  _dos_setvect(0x1c, prev_int_1c);
#else /* DOS */
  sigset_t signals;
  sigemptyset(&signals);
  sigaddset(&signals, SIGVTALRM);
#ifndef MAIKO_OS_HAIKU
  sigaddset(&signals, SIGIO);
#endif
  sigaddset(&signals, SIGALRM);
  sigaddset(&signals, SIGXFSZ);
#ifdef FLTINT
  sigaddset(&signals, SIGFPE);
#endif
  sigprocmask(SIG_BLOCK, &signals, NULL);
#endif /* DOS */
}